

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty
          (FBXExportProperty *this,vector<int,_std::allocator<int>_> *va)

{
  pointer puVar1;
  pointer piVar2;
  ulong uVar3;
  allocator_type local_11;
  
  this->type = 'i';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data,
             (long)(va->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(va->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start,&local_11);
  piVar2 = (va->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((va->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar2) {
    puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    do {
      *(int *)(puVar1 + uVar3 * 4) = piVar2[uVar3];
      uVar3 = uVar3 + 1;
      piVar2 = (va->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar3 < (ulong)((long)(va->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const std::vector<int32_t>& va)
: type('i')
, data(4 * va.size() ) {
    int32_t* d = reinterpret_cast<int32_t*>(data.data());
    for (size_t i = 0; i < va.size(); ++i) {
        d[i] = va[i];
    }
}